

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O2

void __thiscall DIS::FastEntityStatePdu::~FastEntityStatePdu(FastEntityStatePdu *this)

{
  (this->super_EntityInformationFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__FastEntityStatePdu_001b1008;
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::clear
            (&this->_articulationParameters);
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::~vector
            (&this->_articulationParameters);
  EntityInformationFamilyPdu::~EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  return;
}

Assistant:

FastEntityStatePdu::~FastEntityStatePdu()
{
    _articulationParameters.clear();
}